

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O2

bool __thiscall csv::icu::StringDataSource::next(StringDataSource *this)

{
  char16_t cVar1;
  int offset;
  int iVar2;
  
  offset = this->_offset + 1;
  this->_offset = offset;
  if (*(short *)&this->field_0x68 < 0) {
    iVar2 = *(int *)&this->field_0x6c;
  }
  else {
    iVar2 = (int)*(short *)&this->field_0x68 >> 5;
  }
  if (offset < iVar2) {
    (this->super_DataSource)._prev = (this->super_DataSource)._current;
    cVar1 = icu_70::UnicodeString::doCharAt(&this->_in,offset);
    (this->super_DataSource)._current = (uint)(ushort)cVar1;
  }
  return offset < iVar2;
}

Assistant:

bool StringDataSource::next() {
		_offset++;
		if (_offset >= _in.length()) {
			return false;
		}

		_prev = _current;
		_current = _in[_offset];
		return true;
	}